

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeHeapInsert(u32 *aHeap,u32 x)

{
  u32 uVar1;
  bool bVar2;
  uint uVar3;
  uint local_1c;
  u32 i;
  u32 j;
  u32 x_local;
  u32 *aHeap_local;
  
  local_1c = *aHeap + 1;
  *aHeap = local_1c;
  aHeap[local_1c] = x;
  while( true ) {
    uVar3 = local_1c >> 1;
    bVar2 = false;
    if (uVar3 != 0) {
      bVar2 = aHeap[local_1c] < aHeap[uVar3];
    }
    if (!bVar2) break;
    uVar1 = aHeap[uVar3];
    aHeap[uVar3] = aHeap[local_1c];
    aHeap[local_1c] = uVar1;
    local_1c = uVar3;
  }
  return;
}

Assistant:

static void btreeHeapInsert(u32 *aHeap, u32 x){
  u32 j, i = ++aHeap[0];
  aHeap[i] = x;
  while( (j = i/2)>0 && aHeap[j]>aHeap[i] ){
    x = aHeap[j];
    aHeap[j] = aHeap[i];
    aHeap[i] = x;
    i = j;
  }
}